

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::AddEnumValueInternal
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int value)

{
  int number;
  uint32 uVar1;
  Type TVar2;
  int local_24;
  
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar1 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    number = *(int *)(field + 0x38);
    TVar2 = FieldDescriptor::type(field);
    ExtensionSet::AddEnum
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),number,
               (FieldType)TVar2,*(bool *)(*(long *)(field + 0x80) + 0x6c),value,field);
    return;
  }
  AddField<int>(this,message,field,&local_24);
  return;
}

Assistant:

void GeneratedMessageReflection::AddEnumValueInternal(
    Message* message, const FieldDescriptor* field,
    int value) const {
  if (field->is_extension()) {
    MutableExtensionSet(message)->AddEnum(field->number(), field->type(),
                                          field->options().packed(),
                                          value, field);
  } else {
    AddField<int>(message, field, value);
  }
}